

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void uv__pipe_close(uv_pipe_t *handle)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0xe0) != 0) {
    unlink(*(char **)(in_RDI + 0xe0));
    free(*(void **)(in_RDI + 0xe0));
    *(undefined8 *)(in_RDI + 0xe0) = 0;
  }
  uv__stream_close((uv_stream_t *)0x11232b);
  return;
}

Assistant:

void uv__pipe_close(uv_pipe_t* handle) {
  if (handle->pipe_fname) {
    /*
     * Unlink the file system entity before closing the file descriptor.
     * Doing it the other way around introduces a race where our process
     * unlinks a socket with the same name that's just been created by
     * another thread or process.
     */
    unlink(handle->pipe_fname);
    free((void*)handle->pipe_fname);
    handle->pipe_fname = NULL;
  }

  uv__stream_close((uv_stream_t*)handle);
}